

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::BasicSharedStruct::RunIteration
          (BasicSharedStruct *this,bool dispatch_indirect)

{
  GLuint *buffers;
  CallLogWrapper *this_00;
  GLuint GVar1;
  ulong uVar2;
  long lVar3;
  GLuint groups [3];
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,0x100,(allocator_type *)groups);
  buffers = &this->m_storage_buffer;
  GVar1 = this->m_storage_buffer;
  if (GVar1 == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,buffers);
    GVar1 = *buffers;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,GVar1);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,0x1000,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  if (dispatch_indirect) {
    groups._0_8_ = &DAT_100000001;
    groups[2] = 1;
    GVar1 = this->m_dispatch_buffer;
    if (GVar1 == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
      GVar1 = this->m_dispatch_buffer;
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar1);
    glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,groups,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
  }
  else {
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glGetBufferSubData
            (this_00,0x90d2,0,0x1000,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  lVar3 = 0;
  uVar2 = 0;
  do {
    if (uVar2 == 0x100) {
LAB_009c9a2d:
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      return 0xff < uVar2;
    }
    tcu::Vector<float,_4>::Vector
              (&local_50,
               (Vector<float,_4> *)
               ((long)(data.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar3));
    tcu::Vector<float,_4>::Vector(&local_60,(float)(int)uVar2);
    if ((local_50.m_data[0] != local_60.m_data[0]) ||
       (NAN(local_50.m_data[0]) || NAN(local_60.m_data[0]))) {
LAB_009c9a1d:
      anon_unknown_0::Output("Invalid data at index %d.\n",uVar2 & 0xffffffff);
      goto LAB_009c9a2d;
    }
    if ((local_50.m_data[1] != local_60.m_data[1]) ||
       (NAN(local_50.m_data[1]) || NAN(local_60.m_data[1]))) goto LAB_009c9a1d;
    if ((local_50.m_data[2] != local_60.m_data[2]) ||
       (NAN(local_50.m_data[2]) || NAN(local_60.m_data[2]))) goto LAB_009c9a1d;
    if ((local_50.m_data[3] != local_60.m_data[3]) ||
       (NAN(local_50.m_data[3]) || NAN(local_60.m_data[3]))) goto LAB_009c9a1d;
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x10;
  } while( true );
}

Assistant:

bool RunIteration(bool dispatch_indirect)
	{
		const GLuint kBufferSize = 256;

		std::vector<vec4> data(kBufferSize);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(groups), groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * kBufferSize, &data[0]);
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (!IsEqual(data[i], vec4(static_cast<float>(i))))
			{
				Output("Invalid data at index %d.\n", i);
				return false;
			}
		}
		return true;
	}